

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitDataDrop(PrintExpressionContents *this,DataDrop *curr)

{
  DataDrop *curr_local;
  PrintExpressionContents *this_local;
  
  prepareColor(this->o);
  std::operator<<(this->o,"data.drop");
  restoreNormalColor(this->o);
  std::operator<<(this->o,' ');
  wasm::Name::print(&curr->segment,this->o);
  return;
}

Assistant:

void visitDataDrop(DataDrop* curr) {
    prepareColor(o);
    o << "data.drop";
    restoreNormalColor(o);
    o << ' ';
    curr->segment.print(o);
  }